

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O3

string * __thiscall
jaegertracing::propagation::(anonymous_namespace)::
randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen)

{
  string *psVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
  *(ulong *)this = uVar4;
  uVar3 = (int)uVar4 + (int)(uVar4 / 10) * -10;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = (string *)std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar3);
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      uVar2 = (ulong)(*(long *)this * 0x41a7) % 0x7fffffff;
      *(ulong *)this = uVar2;
      psVar1 = (string *)
               CONCAT71((int7)(uVar2 >> 8),
                        "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
                        [(uint)((int)(uVar2 / 0x3e) * -0x3f + (int)(uVar2 / 0x3e) + (int)uVar2)]);
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] =
           "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
           [(uint)((int)(uVar2 / 0x3e) * -0x3f + (int)(uVar2 / 0x3e) + (int)uVar2)];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return psVar1;
}

Assistant:

std::string randomStr(RandomGenerator& gen)
{
    constexpr auto kMaxSize = 10;
    static constexpr char kLetters[] =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789";
    constexpr auto kNumLetters = sizeof(kLetters) - 1;
    const auto size = gen() % kMaxSize;
    std::string result(size, '\0');
    for (auto i = static_cast<size_t>(0); i < size; ++i) {
        const auto pos = gen() % kNumLetters;
        result[i] = kLetters[pos];
    }
    return result;
}